

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

int tclpkcs11_list_objects(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  ProcErrorProc *pPVar1;
  _func_Tcl_Obj_ptr_char_ptr_int *p_Var2;
  _func_void_Tcl_Obj_ptr_Tcl_Obj_ptr *p_Var3;
  Tcl_Interp *pTVar4;
  int iVar5;
  Tcl_Obj *pTVar6;
  CK_RV CVar7;
  long lVar8;
  size_t sVar9;
  Tcl_Obj *pTVar10;
  char *local_11c8;
  char *name;
  CK_RV chk_rv;
  CK_ATTRIBUTE attr_find_class [2];
  undefined4 local_117c;
  undefined8 uStack_1178;
  int count;
  CK_ATTRIBUTE attr_ckavalue [1];
  undefined8 local_1158;
  CK_ATTRIBUTE attr_ckaid [1];
  undefined8 local_1138;
  CK_ATTRIBUTE attr_label [1];
  undefined1 local_1118 [8];
  CK_ATTRIBUTE attr_class [1];
  undefined8 local_10f8;
  CK_ATTRIBUTE attr_find [1];
  CK_ATTRIBUTE *attr_find_obj;
  CK_BYTE ckaid [2048];
  ulong local_8d0;
  CK_OBJECT_CLASS oclass;
  CK_UTF8CHAR label [2048];
  char *objdump;
  char *objtype;
  CK_ULONG ulObjectCount;
  CK_OBJECT_HANDLE hObject;
  CK_SLOT_ID slotid;
  Tcl_Obj *pTStack_98;
  int tcl_rv;
  Tcl_Obj *curr_item_list;
  Tcl_Obj *ret_list;
  Tcl_Obj *obj_value;
  Tcl_Obj *obj_object;
  Tcl_Obj *obj_id;
  Tcl_Obj *obj_label;
  Tcl_Obj *obj_hobj;
  long slotid_long;
  Tcl_Obj *tcl_slotid;
  Tcl_Obj *tcl_handle;
  Tcl_HashEntry *tcl_handle_entry;
  tclpkcs11_handle *handle;
  tclpkcs11_interpdata *interpdata;
  Tcl_Obj **objv_local;
  Tcl_Interp *pTStack_20;
  int objc_local;
  Tcl_Interp *interp_local;
  ClientData cd_local;
  
  objdump = (char *)0x0;
  label[0x7f8] = '\0';
  label[0x7f9] = '\0';
  label[0x7fa] = '\0';
  label[0x7fb] = '\0';
  label[0x7fc] = '\0';
  label[0x7fd] = '\0';
  label[0x7fe] = '\0';
  label[0x7ff] = '\0';
  local_8d0 = 0;
  local_10f8 = 1;
  attr_find[0].type = (CK_ATTRIBUTE_TYPE)&tclpkcs11_list_objects::ltrue;
  attr_find[0].pValue = (CK_VOID_PTR)0x1;
  interpdata = (tclpkcs11_interpdata *)objv;
  objv_local._4_4_ = objc;
  pTStack_20 = interp;
  interp_local = (Tcl_Interp *)cd;
  memset(local_1118,0,0x18);
  pTVar4 = pTStack_20;
  local_1138 = 3;
  attr_label[0].type = 0;
  attr_label[0].pValue = (CK_VOID_PTR)0x0;
  local_1158 = 0x102;
  attr_ckaid[0].type = 0;
  attr_ckaid[0].pValue = (CK_VOID_PTR)0x0;
  uStack_1178 = 0x11;
  attr_ckavalue[0].type = 0;
  attr_ckavalue[0].pValue = (CK_VOID_PTR)0x0;
  chk_rv = 1;
  attr_find_class[0].type = (CK_ATTRIBUTE_TYPE)&tclpkcs11_list_objects::ltrue;
  attr_find_class[0].pValue = (CK_VOID_PTR)0x1;
  attr_find_class[0].ulValueLen = 0;
  attr_find_class[1].type = (CK_ATTRIBUTE_TYPE)&local_8d0;
  attr_find_class[1].pValue = (CK_VOID_PTR)0x8;
  if (interp_local == (Tcl_Interp *)0x0) {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("invalid clientdata",-1);
    (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
    cd_local._4_4_ = 1;
  }
  else if ((objv_local._4_4_ < 3) && (5 < objv_local._4_4_)) {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                       ("wrong # args: should be \"pki::pkcs11::listobjects handle slot [all|privkey|pubkey|cert|data] [value]\""
                        ,-1);
    (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
    cd_local._4_4_ = 1;
  }
  else {
    tcl_slotid = (Tcl_Obj *)(interpdata->handles).staticBuckets[0];
    slotid_long = (long)(interpdata->handles).staticBuckets[1];
    local_117c = 1;
    attr_find[0].ulValueLen = (CK_ULONG)&local_10f8;
    if (3 < objv_local._4_4_) {
      local_117c = 2;
      objdump = (*tclStubsPtr->tcl_GetString)((Tcl_Obj *)(interpdata->handles).staticBuckets[2]);
      iVar5 = strcmp(objdump,"all");
      if (iVar5 == 0) {
        attr_find[0].ulValueLen = (CK_ULONG)&local_10f8;
        local_117c = 1;
      }
      else {
        iVar5 = strcmp(objdump,"cert");
        if (iVar5 == 0) {
          local_8d0 = 1;
        }
        else {
          iVar5 = strcmp(objdump,"pubkey");
          if (iVar5 == 0) {
            local_8d0 = 2;
          }
          else {
            iVar5 = strcmp(objdump,"privkey");
            if (iVar5 == 0) {
              local_8d0 = 3;
            }
            else {
              iVar5 = strcmp(objdump,"data");
              pTVar4 = pTStack_20;
              if (iVar5 != 0) {
                pPVar1 = tclStubsPtr->tcl_SetObjResult;
                pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                                   ("pki::pkcs11::listobjects handle slot [all|privkey|pubkey|cert|data] [value]\""
                                    ,-1);
                (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
                return 1;
              }
              local_8d0 = 0;
            }
          }
        }
        attr_find[0].ulValueLen = (CK_ULONG)&chk_rv;
      }
    }
    if (4 < objv_local._4_4_) {
      label._2040_8_ =
           (*tclStubsPtr->tcl_GetString)((Tcl_Obj *)(interpdata->handles).staticBuckets[3]);
      iVar5 = strcmp((char *)label._2040_8_,"value");
      pTVar4 = pTStack_20;
      if (iVar5 != 0) {
        pPVar1 = tclStubsPtr->tcl_SetObjResult;
        pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                           ("pki::pkcs11::listobjects handle slot [all|privkey|pubkey|cert|data] [value]\""
                            ,-1);
        (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
        return 1;
      }
      iVar5 = strcmp(objdump,"privkey");
      if ((iVar5 == 0) &&
         (iVar5 = strcmp((char *)label._2040_8_,"value"), pTVar4 = pTStack_20, iVar5 == 0)) {
        pPVar1 = tclStubsPtr->tcl_SetObjResult;
        pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                           ("pki::pkcs11::listobjects: cannot value private key\"",-1);
        (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
        return 1;
      }
      iVar5 = strcmp(objdump,"all");
      if ((iVar5 == 0) &&
         (iVar5 = strcmp((char *)label._2040_8_,"value"), pTVar4 = pTStack_20, iVar5 == 0)) {
        pPVar1 = tclStubsPtr->tcl_SetObjResult;
        pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                           ("pki::pkcs11::listobjects: cannot value private key\"",-1);
        (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
        return 1;
      }
    }
    handle = (tclpkcs11_handle *)interp_local;
    tcl_handle = (Tcl_Obj *)(**(code **)&interp_local[2].errorLineDontUse)(interp_local,tcl_slotid);
    pTVar4 = pTStack_20;
    if (tcl_handle == (Tcl_Obj *)0x0) {
      pPVar1 = tclStubsPtr->tcl_SetObjResult;
      pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
      (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
      cd_local._4_4_ = 1;
    }
    else {
      tcl_handle_entry = (Tcl_HashEntry *)tcl_handle->typePtr;
      if ((Tcl_ObjType *)tcl_handle_entry == (Tcl_ObjType *)0x0) {
        pPVar1 = tclStubsPtr->tcl_SetObjResult;
        pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
        (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
        cd_local._4_4_ = 1;
      }
      else {
        slotid._4_4_ = (*tclStubsPtr->tcl_GetLongFromObj)
                                 ((Tcl_Interp_conflict *)pTStack_20,(Tcl_Obj *)slotid_long,
                                  (long *)&obj_hobj);
        cd_local._4_4_ = slotid._4_4_;
        if (slotid._4_4_ == 0) {
          hObject = (CK_OBJECT_HANDLE)obj_hobj;
          iVar5 = tclpkcs11_start_session((tclpkcs11_handle *)tcl_handle_entry,(CK_SLOT_ID)obj_hobj)
          ;
          pTVar4 = pTStack_20;
          if ((long)iVar5 == 0) {
            CVar7 = (**(code **)&tcl_handle_entry->tablePtr[2].numBuckets)
                              ((tcl_handle_entry->key).oneWordValue,attr_find[0].ulValueLen,
                               local_117c);
            pTVar4 = pTStack_20;
            if (CVar7 == 0) {
              curr_item_list = (*tclStubsPtr->tcl_NewObj)();
              while( true ) {
                memset(&oclass,0,0x800);
                attr_class[0].type = (CK_ATTRIBUTE_TYPE)&local_8d0;
                attr_class[0].pValue = (CK_VOID_PTR)0x8;
                attr_label[0].type = (CK_ATTRIBUTE_TYPE)&oclass;
                attr_label[0].pValue = (CK_VOID_PTR)0x800;
                attr_ckaid[0].type = (CK_ATTRIBUTE_TYPE)&attr_find_obj;
                attr_ckaid[0].pValue = (CK_VOID_PTR)0x800;
                CVar7 = (**(code **)&tcl_handle_entry->tablePtr[2].rebuildSize)
                                  ((tcl_handle_entry->key).oneWordValue,&ulObjectCount,1,&objtype);
                pTVar4 = pTStack_20;
                if (CVar7 != 0) break;
                if (objtype == (char *)0x0) {
                  (**(code **)&tcl_handle_entry->tablePtr[2].mask)
                            ((tcl_handle_entry->key).oneWordValue);
                  (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)pTStack_20,curr_item_list)
                  ;
                  return 0;
                }
                if (objtype != (char *)0x1) {
                  pPVar1 = tclStubsPtr->tcl_SetObjResult;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                                     ("FindObjects() returned a weird number of objects.",-1);
                  (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
                  (**(code **)&tcl_handle_entry->tablePtr[2].mask)
                            ((tcl_handle_entry->key).oneWordValue);
                  return 1;
                }
                lVar8 = (*(code *)tcl_handle_entry->tablePtr[2].staticBuckets[2])
                                  ((tcl_handle_entry->key).oneWordValue,ulObjectCount,local_1118,1);
                pTVar4 = pTStack_20;
                if (lVar8 != 0) {
                  pPVar1 = tclStubsPtr->tcl_SetObjResult;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                                     ("C_GetAttributeValue CKA_CLASS for CKA_OBJECT_CLASS.",-1);
                  (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
                  (**(code **)&tcl_handle_entry->tablePtr[2].mask)
                            ((tcl_handle_entry->key).oneWordValue);
                  return 1;
                }
                lVar8 = (*(code *)tcl_handle_entry->tablePtr[2].staticBuckets[2])
                                  ((tcl_handle_entry->key).oneWordValue,ulObjectCount,&local_1138,1)
                ;
                pTVar4 = pTStack_20;
                if (lVar8 != 0) {
                  pPVar1 = tclStubsPtr->tcl_SetObjResult;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                                     ("C_GetAttributeValue CKA_LABEL for CKA_OBJECT_CLASS.",-1);
                  (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
                  (**(code **)&tcl_handle_entry->tablePtr[2].mask)
                            ((tcl_handle_entry->key).oneWordValue);
                  return 1;
                }
                if (local_8d0 < 0x80000000) {
                  local_11c8 = class_name[local_8d0];
                }
                else {
                  local_11c8 = class_name[7];
                }
                p_Var2 = tclStubsPtr->tcl_NewStringObj;
                sVar9 = strlen(local_11c8);
                obj_value = (*p_Var2)(local_11c8,(int)sVar9);
                pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("hobj",-1);
                p_Var3 = tclStubsPtr->tcl_AppendObjToObj;
                obj_label = pTVar6;
                pTVar10 = tclpkcs11_bytearray_to_string((uchar *)&ulObjectCount,8);
                (*p_Var3)(pTVar6,pTVar10);
                obj_id = (*tclStubsPtr->tcl_NewStringObj)((char *)&oclass,(int)attr_label[0].pValue)
                ;
                if (((local_8d0 == 1) || (local_8d0 == 2)) || (local_8d0 == 3)) {
                  lVar8 = (*(code *)tcl_handle_entry->tablePtr[2].staticBuckets[2])
                                    ((tcl_handle_entry->key).oneWordValue,ulObjectCount,&local_1158,
                                     1);
                  pTVar4 = pTStack_20;
                  if (lVar8 != 0) {
                    pPVar1 = tclStubsPtr->tcl_SetObjResult;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                                       ("C_GetAttributeValue CKA_ID for CKA_OBJECT_CLASS.",-1);
                    (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
                    (**(code **)&tcl_handle_entry->tablePtr[2].mask)
                              ((tcl_handle_entry->key).oneWordValue);
                    return 1;
                  }
                  obj_object = tclpkcs11_bytearray_to_string
                                         ((uchar *)&attr_find_obj,
                                          (unsigned_long)attr_ckaid[0].pValue);
                }
                else {
                  obj_object = (*tclStubsPtr->tcl_NewStringObj)("NONE",-1);
                }
                if (objv_local._4_4_ == 5) {
                  attr_ckavalue[0].type = 0;
                  attr_ckavalue[0].pValue = (CK_VOID_PTR)0x0;
                  lVar8 = (*(code *)tcl_handle_entry->tablePtr[2].staticBuckets[2])
                                    ((tcl_handle_entry->key).oneWordValue,ulObjectCount,
                                     &stack0xffffffffffffee88,1);
                  pTVar4 = pTStack_20;
                  if (lVar8 != 0) {
                    pPVar1 = tclStubsPtr->tcl_SetObjResult;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                                       ("C_GetAttributeValue CKA_VALUE for CKA_OBJECT_CLASS.",-1);
                    (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
                    (**(code **)&tcl_handle_entry->tablePtr[2].mask)
                              ((tcl_handle_entry->key).oneWordValue);
                    return 1;
                  }
                  attr_ckavalue[0].type =
                       (CK_ATTRIBUTE_TYPE)(*tclStubsPtr->tcl_Alloc)((uint)attr_ckavalue[0].pValue);
                  lVar8 = (*(code *)tcl_handle_entry->tablePtr[2].staticBuckets[2])
                                    ((tcl_handle_entry->key).oneWordValue,ulObjectCount,
                                     &stack0xffffffffffffee88,1);
                  pTVar4 = pTStack_20;
                  if (lVar8 != 0) {
                    pPVar1 = tclStubsPtr->tcl_SetObjResult;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                                       ("C_GetAttributeValue CKA_VALUE 1 for CKA_OBJECT_CLASS.",-1);
                    (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
                    (**(code **)&tcl_handle_entry->tablePtr[2].mask)
                              ((tcl_handle_entry->key).oneWordValue);
                    return 1;
                  }
                  ret_list = tclpkcs11_bytearray_to_string
                                       ((uchar *)attr_ckavalue[0].type,
                                        (unsigned_long)attr_ckavalue[0].pValue);
                  (*tclStubsPtr->tcl_Free)((char *)attr_ckavalue[0].type);
                }
                pTStack_98 = (*tclStubsPtr->tcl_NewObj)();
                (*tclStubsPtr->tcl_ListObjAppendElement)
                          ((Tcl_Interp_conflict *)pTStack_20,pTStack_98,obj_value);
                (*tclStubsPtr->tcl_ListObjAppendElement)
                          ((Tcl_Interp_conflict *)pTStack_20,pTStack_98,obj_label);
                (*tclStubsPtr->tcl_ListObjAppendElement)
                          ((Tcl_Interp_conflict *)pTStack_20,pTStack_98,obj_id);
                if (((local_8d0 == 1) || (local_8d0 == 2)) || (local_8d0 == 3)) {
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)pTStack_20,pTStack_98,obj_object);
                }
                if (objv_local._4_4_ == 5) {
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)pTStack_20,pTStack_98,ret_list);
                }
                (*tclStubsPtr->tcl_ListObjAppendElement)
                          ((Tcl_Interp_conflict *)pTStack_20,curr_item_list,pTStack_98);
              }
              pPVar1 = tclStubsPtr->tcl_SetObjResult;
              pTVar6 = tclpkcs11_pkcs11_error(CVar7);
              (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
              (**(code **)&tcl_handle_entry->tablePtr[2].mask)((tcl_handle_entry->key).oneWordValue)
              ;
              cd_local._4_4_ = 1;
            }
            else {
              pPVar1 = tclStubsPtr->tcl_SetObjResult;
              pTVar6 = tclpkcs11_pkcs11_error(CVar7);
              (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
              cd_local._4_4_ = 1;
            }
          }
          else {
            pPVar1 = tclStubsPtr->tcl_SetObjResult;
            pTVar6 = tclpkcs11_pkcs11_error((long)iVar5);
            (*pPVar1)((Tcl_Interp_conflict *)pTVar4,pTVar6);
            cd_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return cd_local._4_4_;
}

Assistant:

MODULE_SCOPE int tclpkcs11_list_objects(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  //    CK_BYTE *value = NULL;
  //    CK_ULONG value_len = 0;

  static CK_BBOOL ltrue = CK_TRUE;
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid;
  long slotid_long;
  Tcl_Obj *obj_hobj, *obj_label, *obj_id, *obj_object, *obj_value;
  //	Tcl_Obj *obj_hobj1;
  Tcl_Obj *ret_list, *curr_item_list;
  int tcl_rv;
  CK_SLOT_ID slotid;
  CK_OBJECT_HANDLE hObject;
  CK_ULONG ulObjectCount;
  //	static CK_OBJECT_CLASS     oclass     = CKO_CERTIFICATE;
  //	                           {CKA_ID, NULL, 0},
  char *objtype = NULL, *objdump = NULL;
  CK_UTF8CHAR label[2048];

  CK_OBJECT_CLASS oclass = 0;
  CK_BYTE ckaid[2048];
  //	CK_BYTE *ckavalue;
  CK_ATTRIBUTE *attr_find_obj;

  CK_ATTRIBUTE attr_find[] = {
    {CKA_TOKEN, &ltrue, sizeof(ltrue)},
  };
  CK_ATTRIBUTE attr_class[] = {
    {CKA_CLASS, NULL, 0},
  };
  CK_ATTRIBUTE attr_label[] = {
    {CKA_LABEL, NULL, 0},
  };
  CK_ATTRIBUTE attr_ckaid[] = {
    {CKA_ID, NULL, 0},
  };
  CK_ATTRIBUTE attr_ckavalue[] = {
    {CKA_VALUE, NULL, 0},
  };
  int count;
  	
  CK_ATTRIBUTE attr_find_class[] = {
    {CKA_TOKEN, &ltrue, sizeof(ltrue)},
    {CKA_CLASS, &oclass, sizeof(oclass)},
  };

  CK_RV chk_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc < 3 && objc > 5) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::listobjects handle slot [all|privkey|pubkey|cert|data] [value]\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];
  count = 1;
  attr_find_obj = attr_find;
  if (objc > 3) {
    count = 2;
    objtype = Tcl_GetString(objv[3]);
    //fprintf(stderr, "LISTOBJECTS objtype=%s\n", objtype);
    if (strcmp(objtype, "all") == 0) {
      attr_find_obj = attr_find;
      count = 1;
    } else if (strcmp(objtype, "cert") == 0) {
      attr_find_obj = attr_find;
      oclass = CKO_CERTIFICATE;
      attr_find_obj = attr_find_class;
    } else if (strcmp(objtype, "pubkey") == 0) {
      attr_find_obj = attr_find;
      oclass = CKO_PUBLIC_KEY;
      attr_find_obj = attr_find_class;
    } else if (strcmp(objtype, "privkey") == 0) {
      attr_find_obj = attr_find;
      oclass = CKO_PRIVATE_KEY;
      attr_find_obj = attr_find_class;
    } else if (strcmp(objtype, "data") == 0) {
      attr_find_obj = attr_find;
      oclass = CKO_DATA;
      attr_find_obj = attr_find_class;
    } else {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("pki::pkcs11::listobjects handle slot [all|privkey|pubkey|cert|data] [value]\"", -1));
      return(TCL_ERROR);
    }
  }
  if (objc > 4) {
    objdump = Tcl_GetString(objv[4]);
    if (strcmp(objdump, "value") != 0) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("pki::pkcs11::listobjects handle slot [all|privkey|pubkey|cert|data] [value]\"", -1));
      return(TCL_ERROR);
    }
    if (strcmp(objtype, "privkey") == 0 && (strcmp(objdump, "value") == 0)) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("pki::pkcs11::listobjects: cannot value private key\"", -1));
      return(TCL_ERROR);
    }
    if (strcmp(objtype, "all") == 0 && (strcmp(objdump, "value") == 0)) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("pki::pkcs11::listobjects: cannot value private key\"", -1));
      return(TCL_ERROR);
    }
    //fprintf(stderr, "LISTOBJECTS objdump=%s\n", objdump);
  }

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;

  chk_rv = tclpkcs11_start_session(handle, slotid);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  chk_rv = handle->pkcs11->C_FindObjectsInit(handle->session,  attr_find_obj, count);
  //	chk_rv = handle->pkcs11->C_FindObjectsInit(handle->session,  attr_find_obj, sizeof(attr_find) / sizeof(CK_ATTRIBUTE));
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  ret_list = Tcl_NewObj();
  while (1) {
    char *name = NULL;
    memset(label, 0, sizeof(label));
    attr_class[0].pValue = &oclass;
    attr_class[0].ulValueLen = sizeof(oclass);
    attr_label[0].pValue = label;
    attr_label[0].ulValueLen = sizeof(label);
    attr_ckaid[0].pValue = ckaid;
    attr_ckaid[0].ulValueLen = sizeof(ckaid);


    chk_rv = handle->pkcs11->C_FindObjects(handle->session, &hObject, 1, &ulObjectCount);
    if (chk_rv != CKR_OK) {
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      handle->pkcs11->C_FindObjectsFinal(handle->session);

      return(TCL_ERROR);
    }

    if (ulObjectCount == 0) {
      break;
    }

    if (ulObjectCount != 1) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("FindObjects() returned a weird number of objects.", -1));

      handle->pkcs11->C_FindObjectsFinal(handle->session);

      return(TCL_ERROR);
    }
    //////////////////////
    chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, attr_class, sizeof(attr_class)/sizeof(CK_ATTRIBUTE));
    if (chk_rv != CKR_OK) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("C_GetAttributeValue CKA_CLASS for CKA_OBJECT_CLASS.", -1));
      handle->pkcs11->C_FindObjectsFinal(handle->session);
      return(TCL_ERROR);
    }
    chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, attr_label, sizeof(attr_label)/sizeof(CK_ATTRIBUTE));
    if (chk_rv != CKR_OK) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("C_GetAttributeValue CKA_LABEL for CKA_OBJECT_CLASS.", -1));
      handle->pkcs11->C_FindObjectsFinal(handle->session);
      return(TCL_ERROR);
    }
    if (oclass >= CKO_VENDOR_DEFINED) {
      name = class_name[7];
    } else {
      name = class_name[oclass];
    }
    obj_object = Tcl_NewStringObj(name, strlen(name));
    		

    obj_hobj = Tcl_NewStringObj("hobj", -1);
    Tcl_AppendObjToObj(obj_hobj, tclpkcs11_bytearray_to_string((const unsigned char *)&hObject, sizeof(CK_OBJECT_HANDLE)));
    /*
    //Восстановление HANDLE объекта в функциях, где они будут задействованы
    objtype = Tcl_GetString(obj_hobj);
    obj_hobj1 = Tcl_NewStringObj(objtype + 4, -1);
    //tcl_strtobytearray_rv
    tclpkcs11_string_to_bytearray(obj_hobj1, (CK_OBJECT_HANDLE*)&hObject, Tcl_GetCharLength(obj_hobj1) / 2);
    */
    //fprintf(stderr, "%s\n", name);
    //fprintf(stderr, "\t label: '%s'\n", label);
    obj_label = Tcl_NewStringObj((const char *)label, attr_label[0].ulValueLen);

    if (oclass == CKO_CERTIFICATE || oclass == CKO_PUBLIC_KEY || oclass == CKO_PRIVATE_KEY) {
      chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, attr_ckaid, sizeof(attr_ckaid)/sizeof(CK_ATTRIBUTE));
      if (chk_rv != CKR_OK) {
        Tcl_SetObjResult(interp, Tcl_NewStringObj("C_GetAttributeValue CKA_ID for CKA_OBJECT_CLASS.", -1));
        handle->pkcs11->C_FindObjectsFinal(handle->session);
        return(TCL_ERROR);
      }
      // Convert the ID into a readable string
      obj_id = tclpkcs11_bytearray_to_string(ckaid, attr_ckaid[0].ulValueLen);
    } else {
      obj_id = Tcl_NewStringObj("NONE", -1);
    }
    if (objc == 5) {
      attr_ckavalue[0].pValue = NULL;
      attr_ckavalue[0].ulValueLen = 0;
      chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, attr_ckavalue, sizeof(attr_ckavalue)/sizeof(CK_ATTRIBUTE));
      if (chk_rv != CKR_OK) {
        Tcl_SetObjResult(interp, Tcl_NewStringObj("C_GetAttributeValue CKA_VALUE for CKA_OBJECT_CLASS.", -1));
        handle->pkcs11->C_FindObjectsFinal(handle->session);
        return(TCL_ERROR);
      }
      //fprintf(stderr, "LEN=%i\n", attr_ckavalue[0].ulValueLen);
      attr_ckavalue[0].pValue = ckalloc(attr_ckavalue[0].ulValueLen);
      chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, attr_ckavalue, sizeof(attr_ckavalue)/sizeof(CK_ATTRIBUTE));
      if (chk_rv != CKR_OK) {
        Tcl_SetObjResult(interp, Tcl_NewStringObj("C_GetAttributeValue CKA_VALUE 1 for CKA_OBJECT_CLASS.", -1));
        handle->pkcs11->C_FindObjectsFinal(handle->session);
        return(TCL_ERROR);
      }
      obj_value = tclpkcs11_bytearray_to_string(attr_ckavalue[0].pValue, attr_ckavalue[0].ulValueLen);
      ckfree(attr_ckavalue[0].pValue);
    }
    /* Create the current item list */
    curr_item_list = Tcl_NewObj();
    //		Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_object", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_object);

    //		Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("handle_object", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_hobj);

    //		Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_label", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_label);

    if (oclass == CKO_CERTIFICATE || oclass == CKO_PUBLIC_KEY || oclass == CKO_PRIVATE_KEY) {
      //		    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_id", -1));
      Tcl_ListObjAppendElement(interp, curr_item_list, obj_id);
    }
    if (objc == 5) {
      Tcl_ListObjAppendElement(interp, curr_item_list, obj_value);
    }
    /* Add the current item to the return value list */
    Tcl_ListObjAppendElement(interp, ret_list, curr_item_list);
  }

  /* Terminate search */
  handle->pkcs11->C_FindObjectsFinal(handle->session);

  /* Return */
  Tcl_SetObjResult(interp, ret_list);
  //	Tcl_SetObjResult(interp, curr_item_list);

  return(TCL_OK);
}